

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O3

CaseTreeNode * tcu::parseCaseList(istream *in)

{
  size_t __n;
  long lVar1;
  byte bVar2;
  bool bVar3;
  size_type sVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  CaseTreeNode *pCVar9;
  invalid_argument *piVar10;
  pointer ppCVar11;
  int iVar12;
  string curName;
  vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> nodeStack;
  string local_98;
  vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> local_78;
  CaseTreeNode *local_58;
  char *local_50;
  CaseTreeNode *local_48;
  CaseTreeNode *local_40;
  long local_38;
  
  pCVar9 = (CaseTreeNode *)operator_new(0x38);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  (pCVar9->m_name)._M_dataplus._M_p = (pointer)&(pCVar9->m_name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pCVar9,local_98._M_dataplus._M_p,
             local_98._M_dataplus._M_p + local_98._M_string_length);
  (pCVar9->m_children).super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar9->m_children).super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar9->m_children).super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = pCVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  iVar5 = std::istream::peek();
  if (iVar5 == 0x7b) {
    local_48 = local_58;
    local_78.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (CaseTreeNode **)0x0;
    local_78.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (CaseTreeNode **)0x0;
    local_78.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (CaseTreeNode **)0x0;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    iVar5 = std::istream::get();
    if (iVar5 != 0x7b) {
      piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar10,"Malformed case trie");
      __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    std::vector<tcu::CaseTreeNode*,std::allocator<tcu::CaseTreeNode*>>::
    _M_realloc_insert<tcu::CaseTreeNode*const&>
              ((vector<tcu::CaseTreeNode*,std::allocator<tcu::CaseTreeNode*>> *)&local_78,
               (iterator)0x0,&local_48);
    if (local_78.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_78.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar3 = true;
      local_50 = "Missing node separator";
      do {
        uVar6 = std::istream::get();
        sVar4 = local_98._M_string_length;
        if (uVar6 + 1 < 2) {
          piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar10,"Unterminated case tree");
          goto LAB_005c5f91;
        }
        if (((uVar6 == 0x2c) || (uVar6 == 0x7d)) || (uVar6 == 0x7b)) {
          if (local_98._M_string_length == 0) {
            if (bVar3) {
              local_50 = "Empty node name";
              goto LAB_005c5f77;
            }
          }
          else {
            if (!bVar3) {
LAB_005c5f77:
              piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar10,local_50);
LAB_005c5f91:
              __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            pCVar9 = (CaseTreeNode *)operator_new(0x38);
            (pCVar9->m_name)._M_dataplus._M_p = (pointer)&(pCVar9->m_name).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)pCVar9,local_98._M_dataplus._M_p,local_98._M_dataplus._M_p + sVar4)
            ;
            (pCVar9->m_children).
            super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pCVar9->m_children).
            super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pCVar9->m_children).
            super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_40 = pCVar9;
            CaseTreeNode::addChild
                      (local_78.
                       super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1],pCVar9);
            if (uVar6 == 0x7b) {
              if (local_78.
                  super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_78.
                  super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<tcu::CaseTreeNode*,std::allocator<tcu::CaseTreeNode*>>::
                _M_realloc_insert<tcu::CaseTreeNode*const&>
                          ((vector<tcu::CaseTreeNode*,std::allocator<tcu::CaseTreeNode*>> *)
                           &local_78,
                           (iterator)
                           local_78.
                           super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_40);
              }
              else {
                *local_78.
                 super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish = local_40;
                local_78.
                super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_78.
                     super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            local_98._M_string_length = 0;
            *local_98._M_dataplus._M_p = '\0';
          }
          bVar3 = true;
          if (uVar6 == 0x7d) {
            local_78.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_78.
                 super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1;
            if (local_78.
                super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                local_78.
                super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              iVar5 = std::istream::peek();
              if (iVar5 == 0xd) {
                std::istream::get();
              }
              iVar5 = std::istream::peek();
              if (iVar5 == 10) {
                std::istream::get();
              }
            }
            bVar3 = false;
          }
        }
        else {
          bVar2 = (byte)uVar6;
          if (((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
             ((bVar2 != 0x5f && ((uVar6 & 0xff) != 0x2d)))) {
            piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar10,"Illegal character in node name");
            goto LAB_005c5f91;
          }
          std::__cxx11::string::push_back((char)&local_98);
        }
      } while (local_78.
               super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl
               .super__Vector_impl_data._M_start !=
               local_78.
               super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_005c5eaa;
    lVar1 = CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,local_98.field_2._M_local_buf[0]);
  }
  else {
    local_78.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (CaseTreeNode **)0x0;
    local_78.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (CaseTreeNode **)0x0;
    local_78.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (CaseTreeNode **)0x0;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    local_48 = (CaseTreeNode *)0x0;
    std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::resize
              (&local_78,8,&local_48);
    *local_78.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
     super__Vector_impl_data._M_start = local_58;
    iVar5 = 0;
LAB_005c5c34:
    do {
      while( true ) {
        uVar6 = std::istream::get();
        sVar4 = local_98._M_string_length;
        uVar7 = uVar6 + 1;
        if (uVar7 < 0x30) break;
LAB_005c5c5b:
        bVar2 = (byte)uVar6;
        if ((((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
            (bVar2 != 0x5f)) && ((uVar6 & 0xff) != 0x2d)) {
          piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar10,"Illegal character in test case name");
LAB_005c5f5c:
          __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        std::__cxx11::string::push_back((char)&local_98);
      }
      if ((0x4803UL >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
        if ((ulong)uVar7 != 0x2f) goto LAB_005c5c5b;
        if (local_98._M_string_length == 0) {
          piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar10,"Empty test group name");
          goto LAB_005c5f5c;
        }
        iVar12 = iVar5 + 1;
        if ((int)((ulong)((long)local_78.
                                super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_78.
                               super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) <= iVar12) {
          local_48 = (CaseTreeNode *)0x0;
          std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::resize
                    (&local_78,
                     (long)local_78.
                           super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_78.
                           super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2,&local_48);
        }
        ppCVar11 = local_78.
                   super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pCVar9 = local_78.
                 super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar12];
        if (((pCVar9 == (CaseTreeNode *)0x0) ||
            (__n = (pCVar9->m_name)._M_string_length, __n != local_98._M_string_length)) ||
           ((__n != 0 &&
            (iVar8 = bcmp((pCVar9->m_name)._M_dataplus._M_p,local_98._M_dataplus._M_p,__n),
            iVar8 != 0)))) {
          local_38 = (long)iVar5;
          pCVar9 = ppCVar11[local_38];
          local_50 = (char *)(long)iVar12;
          iVar8 = CaseTreeNode::findChildNdx(pCVar9,&local_98);
          if ((iVar8 == -1) ||
             (pCVar9 = (pCVar9->m_children).
                       super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar8],
             pCVar9 == (CaseTreeNode *)0x0)) {
            pCVar9 = (CaseTreeNode *)operator_new(0x38);
            (pCVar9->m_name)._M_dataplus._M_p = (pointer)&(pCVar9->m_name).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)pCVar9,local_98._M_dataplus._M_p,
                       local_98._M_dataplus._M_p + local_98._M_string_length);
            (pCVar9->m_children).
            super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pCVar9->m_children).
            super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pCVar9->m_children).
            super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            CaseTreeNode::addChild
                      (local_78.
                       super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_38],pCVar9);
            ppCVar11 = local_78.
                       super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          }
          ppCVar11[(long)local_50] = pCVar9;
          if (iVar5 + 2 <
              (int)((ulong)((long)local_78.
                                  super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_78.
                                 super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
            local_78.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar5 + 2] = (CaseTreeNode *)0x0;
          }
        }
        local_98._M_string_length = 0;
        *local_98._M_dataplus._M_p = '\0';
        iVar5 = iVar12;
        goto LAB_005c5c34;
      }
      if (local_98._M_string_length == 0) {
        piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar10,"Empty test case name");
        goto LAB_005c5f5c;
      }
      iVar12 = CaseTreeNode::findChildNdx
                         (local_78.
                          super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar5],&local_98);
      if (iVar12 != -1) {
        piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar10,"Duplicate test case");
        goto LAB_005c5f5c;
      }
      pCVar9 = (CaseTreeNode *)operator_new(0x38);
      (pCVar9->m_name)._M_dataplus._M_p = (pointer)&(pCVar9->m_name).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)pCVar9,local_98._M_dataplus._M_p,local_98._M_dataplus._M_p + sVar4);
      (pCVar9->m_children).
      super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pCVar9->m_children).
      super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pCVar9->m_children).
      super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      CaseTreeNode::addChild
                (local_78.
                 super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar5],pCVar9);
      local_98._M_string_length = 0;
      *local_98._M_dataplus._M_p = '\0';
      if ((uVar6 == 0xd) && (iVar5 = std::istream::peek(), iVar5 == 10)) {
        std::istream::get();
      }
      iVar12 = std::istream::peek();
      iVar5 = 0;
    } while (1 < iVar12 + 1U);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_005c5eaa;
    lVar1 = CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,local_98.field_2._M_local_buf[0]);
  }
  operator_delete(local_98._M_dataplus._M_p,lVar1 + 1);
LAB_005c5eaa:
  if (local_78.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl
      .super__Vector_impl_data._M_start != (CaseTreeNode **)0x0) {
    operator_delete(local_78.
                    super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar5 = std::istream::get();
  if (1 < iVar5 + 1U) {
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar10,"Trailing characters at end of case list");
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return local_58;
}

Assistant:

static CaseTreeNode* parseCaseList (std::istream& in)
{
	CaseTreeNode* const root = new CaseTreeNode("");
	try
	{
		if (in.peek() == '{')
			parseCaseTrie(root, in);
		else
			parseCaseList(root, in);

		{
			const int curChr = in.get();
			if (curChr != std::char_traits<char>::eof() && curChr != 0)
				throw std::invalid_argument("Trailing characters at end of case list");
		}

		return root;
	}
	catch (...)
	{
		delete root;
		throw;
	}
}